

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O3

void __thiscall
HACD::HullLibrary::BringOutYourDead
          (HullLibrary *this,HaF32 *verts,HaU32 vcount,HaF32 *overts,HaU32 *ocount,HaU32 *indices,
          HaU32 indexcount)

{
  int iVar1;
  HaU32 HVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  __ptr = calloc(1,(ulong)vcount << 2);
  *ocount = 0;
  if (indexcount != 0) {
    uVar3 = 0;
    do {
      uVar5 = indices[uVar3];
      uVar4 = (ulong)uVar5;
      if (vcount <= uVar5) {
        __assert_fail("v < vcount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                      ,0xc1,
                      "void HACD::HullLibrary::BringOutYourDead(const hacd::HaF32 *, hacd::HaU32, hacd::HaF32 *, hacd::HaU32 &, hacd::HaU32 *, hacd::HaU32)"
                     );
      }
      iVar1 = *(int *)((long)__ptr + uVar4 * 4);
      if (iVar1 == 0) {
        HVar2 = *ocount;
        indices[uVar3] = HVar2;
        overts[HVar2 * 3] = verts[uVar5 * 3];
        overts[HVar2 * 3 + 1] = verts[uVar4 * 3 + 1 & 0xffffffff];
        uVar5 = HVar2 + 1;
        overts[HVar2 * 3 + 2] = verts[uVar4 * 3 + 2 & 0xffffffff];
        *ocount = uVar5;
        if (vcount < uVar5) {
          __assert_fail("ocount <= vcount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                        ,0xd2,
                        "void HACD::HullLibrary::BringOutYourDead(const hacd::HaF32 *, hacd::HaU32, hacd::HaF32 *, hacd::HaU32 &, hacd::HaU32 *, hacd::HaU32)"
                       );
        }
        *(uint *)((long)__ptr + uVar4 * 4) = uVar5;
      }
      else {
        indices[uVar3] = iVar1 - 1;
      }
      uVar3 = uVar3 + 1;
    } while (indexcount != uVar3);
  }
  free(__ptr);
  return;
}

Assistant:

void HullLibrary::BringOutYourDead(const hacd::HaF32 *verts,hacd::HaU32 vcount, hacd::HaF32 *overts,hacd::HaU32 &ocount,hacd::HaU32 *indices,hacd::HaU32 indexcount)
{
	hacd::HaU32 *used = (hacd::HaU32 *)HACD_ALLOC(sizeof(hacd::HaU32)*vcount);
	memset(used,0,sizeof(hacd::HaU32)*vcount);

	ocount = 0;

	for (hacd::HaU32 i=0; i<indexcount; i++)
	{
		hacd::HaU32 v = indices[i]; // original array index

		HACD_ASSERT( v < vcount );

		if ( used[v] ) // if already remapped
		{
			indices[i] = used[v]-1; // index to new array
		}
		else
		{

			indices[i] = ocount;      // new index mapping

			overts[ocount*3+0] = verts[v*3+0]; // copy old vert to new vert array
			overts[ocount*3+1] = verts[v*3+1];
			overts[ocount*3+2] = verts[v*3+2];

			ocount++; // increment output vert count

			HACD_ASSERT( ocount <= vcount );

			used[v] = ocount; // assign new index remapping
		}
	}

	HACD_FREE(used);
}